

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O2

char * Extra_FileDesignName(char *pFileName)

{
  byte *pbVar1;
  byte bVar2;
  size_t __size;
  char *pcVar3;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  
  for (pbVar5 = (byte *)pFileName; (*pbVar5 != 0x2e && (*pbVar5 != 0)); pbVar5 = pbVar5 + 1) {
  }
  __size = 1;
  pbVar6 = pbVar5;
  while ((pbVar1 = pbVar6 + -1, pFileName <= pbVar1 &&
         ((bVar2 = *pbVar1, (byte)((bVar2 & 0xdf) + 0xbf) < 0x1a ||
          (bVar2 == 0x5f || (byte)(bVar2 - 0x30) < 10))))) {
    __size = __size + 1;
    pbVar6 = pbVar1;
  }
  pcVar3 = (char *)malloc(__size);
  for (lVar4 = 0; pbVar6 + lVar4 < pbVar5; lVar4 = lVar4 + 1) {
    pcVar3[lVar4] = pbVar6[lVar4];
  }
  pcVar3[lVar4] = '\0';
  return pcVar3;
}

Assistant:

char * Extra_FileDesignName( char * pFileName )
{
    char * pBeg, * pEnd, * pStore, * pCur;
    // find the first dot
    for ( pEnd = pFileName; *pEnd; pEnd++ )
        if ( *pEnd == '.' )
            break;
    // find the first char
    for ( pBeg = pEnd - 1; pBeg >= pFileName; pBeg-- )
        if ( !((*pBeg >= 'a' && *pBeg <= 'z') || (*pBeg >= 'A' && *pBeg <= 'Z') || (*pBeg >= '0' && *pBeg <= '9') || *pBeg == '_') )
            break;
    pBeg++;
    // fill up storage
    pStore = ABC_ALLOC( char, pEnd - pBeg + 1 );
    for ( pCur = pStore; pBeg < pEnd; pBeg++, pCur++ )
        *pCur = *pBeg;
    *pCur = 0;
    return pStore;
}